

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::compute_order::compute_order
          (compute_order *this,constraint_order order_,int variable_number)

{
  constraint_order cVar1;
  allocator_type local_1a;
  allocator_type local_19;
  
  std::vector<int,_std::allocator<int>_>::vector(&this->R,(long)variable_number,&local_19);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&this->m_order,(long)variable_number,&local_1a);
  cVar1 = none;
  if (order_ != cycle) {
    cVar1 = order_;
  }
  this->order = cVar1;
  this->use_cycle = order_ == cycle;
  return;
}

Assistant:

compute_order(const solver_parameters::constraint_order order_,
                  const int variable_number)
      : R(static_cast<std::vector<int>::size_type>(variable_number))
      , m_order(static_cast<std::vector<int>::size_type>(variable_number))
      , order(order_ == solver_parameters::constraint_order::cycle
                ? solver_parameters::constraint_order::none
                : order_)
      , use_cycle(order_ == solver_parameters::constraint_order::cycle)
    {}